

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::
     BitpackingWriter::WriteConstant(hugeint_t constant,idx_t count,void *data_ptr,bool all_invalid)

{
  byte bVar1;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *in_RCX;
  uint64_t in_RSI;
  data_ptr_t *in_RDI;
  byte in_R8B;
  hugeint_t val;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *state;
  idx_t in_stack_ffffffffffffffb8;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  BitpackingMode mode;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *state_00;
  undefined7 in_stack_ffffffffffffffd8;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *state_01;
  
  mode = (BitpackingMode)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  bVar1 = in_R8B & 1;
  state_00 = in_RCX;
  state_01 = in_RCX;
  ReserveSpace(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  WriteMetaData(state_00,mode);
  val.upper = (int64_t)in_RCX;
  val.lower = in_RSI;
  WriteData<duckdb::hugeint_t>((BitpackingWriter *)&state_00->data_ptr,in_RDI,val);
  UpdateStats(state_01,CONCAT17(bVar1,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

static void WriteConstant(T constant, idx_t count, void *data_ptr, bool all_invalid) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}